

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.hpp
# Opt level: O1

TextureLayerAttachment * __thiscall
deqp::gls::FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::TextureLayerAttachment>
          (FboBuilder *this)

{
  TextureLayerAttachment *pTVar1;
  TextureLayerAttachment *local_18;
  
  pTVar1 = (TextureLayerAttachment *)operator_new(0x18);
  (pTVar1->super_TextureAttachment).super_Attachment.target = 0x8d40;
  (pTVar1->super_TextureAttachment).super_Attachment.imageName = 0;
  *(undefined8 *)&(pTVar1->super_TextureAttachment).level = 0;
  (pTVar1->super_TextureAttachment).super_Attachment.super_Config._vptr_Config =
       (_func_int **)&PTR__Config_0218fb50;
  local_18 = pTVar1;
  std::
  _Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
  ::_M_insert_unique<deqp::gls::FboUtil::config::Config*>
            ((_Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
              *)&this->m_configs,(Config **)&local_18);
  return pTVar1;
}

Assistant:

Config&						makeConfig		(void)
	{
		Config* cfg = new Config();
		m_configs.insert(cfg);
		return *cfg;
	}